

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_OStream.cc
# Opt level: O0

void __thiscall Pl_OStream::~Pl_OStream(Pl_OStream *this)

{
  Pl_OStream *this_local;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_OStream_0058b480;
  std::unique_ptr<Pl_OStream::Members,_std::default_delete<Pl_OStream::Members>_>::~unique_ptr
            (&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_OStream::~Pl_OStream() = default;